

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

bool __thiscall TRM::Edge::intersect(Edge *this,Edge *other,vec2 *point)

{
  float fVar1;
  double dVar2;
  Vertex *pVVar3;
  Vertex *pVVar4;
  Vertex *pVVar5;
  Vertex *pVVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  
  pVVar3 = this->top;
  pVVar4 = other->top;
  if (pVVar3 != pVVar4) {
    pVVar5 = this->bottom;
    if (pVVar5 == pVVar4) {
      return false;
    }
    pVVar6 = other->bottom;
    if (pVVar5 == pVVar6) {
      return false;
    }
    if (pVVar3 == pVVar6) {
      return false;
    }
    fVar7 = *(float *)(pVVar5 + 0x48);
    fVar8 = *(float *)(pVVar3 + 0x48);
    fVar12 = fVar7;
    if (fVar8 <= fVar7) {
      fVar12 = fVar8;
    }
    fVar1 = *(float *)(pVVar4 + 0x48);
    fVar9 = *(float *)(pVVar6 + 0x48);
    fVar13 = fVar9;
    if (fVar9 <= fVar1) {
      fVar13 = fVar1;
    }
    if (fVar12 <= fVar13) {
      if (fVar7 <= fVar8) {
        fVar7 = fVar8;
      }
      if (fVar1 <= fVar9) {
        fVar9 = fVar1;
      }
      if (fVar9 <= fVar7) {
        fVar7 = *(float *)(pVVar5 + 0x4c);
        fVar12 = *(float *)(pVVar3 + 0x4c);
        fVar9 = fVar7;
        if (fVar12 <= fVar7) {
          fVar9 = fVar12;
        }
        fVar13 = *(float *)(pVVar4 + 0x4c);
        fVar10 = *(float *)(pVVar6 + 0x4c);
        fVar14 = fVar10;
        if (fVar10 <= fVar13) {
          fVar14 = fVar13;
        }
        if (fVar9 <= fVar14) {
          if (fVar7 <= fVar12) {
            fVar7 = fVar12;
          }
          if (fVar13 <= fVar10) {
            fVar10 = fVar13;
          }
          if (fVar10 <= fVar7) {
            dVar2 = this->le_b;
            dVar11 = this->le_a * other->le_b - other->le_a * dVar2;
            if ((dVar11 != 0.0) || (NAN(dVar11))) {
              dVar15 = (double)fVar1 - (double)fVar8;
              dVar16 = other->le_b * ((double)fVar13 - (double)fVar12) + other->le_a * dVar15;
              dVar15 = ((double)fVar13 - (double)fVar12) * dVar2 + dVar15 * this->le_a;
              if (dVar11 <= 0.0) {
                if (0.0 < dVar16) {
                  return false;
                }
                if (dVar16 < dVar11) {
                  return false;
                }
                if (0.0 < dVar15) {
                  return false;
                }
                if (dVar15 < dVar11) {
                  return false;
                }
              }
              else {
                if (dVar16 < 0.0) {
                  return false;
                }
                if (dVar11 < dVar16) {
                  return false;
                }
                if (dVar15 < 0.0) {
                  return false;
                }
                if (dVar11 < dVar15) {
                  return false;
                }
              }
              fVar7 = roundf((float)((double)fVar8 - dVar2 * dVar16 * (1.0 / dVar11)));
              (point->field_0).x = fVar7;
              fVar8 = roundf((float)(dVar16 * this->le_a * (1.0 / dVar11) +
                                    (double)*(float *)(this->top + 0x4c)));
              (point->field_1).y = fVar8;
              if (ABS(fVar7) != INFINITY) {
                return ABS(fVar8) != INFINITY;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Edge::intersect(Edge* other, glm::vec2* point) {
  if (top == other->top || bottom == other->bottom || top == other->bottom ||
      bottom == other->top) {
    return false;
  }

  // check if two aabb bounds is intersect
  if (std::min(top->point.x, bottom->point.x) >
          std::max(other->top->point.x, other->bottom->point.x) ||
      std::max(top->point.x, bottom->point.x) <
          std::min(other->top->point.x, other->bottom->point.x) ||
      std::min(top->point.y, bottom->point.y) >
          std::max(other->top->point.y, other->bottom->point.y) ||
      std::max(top->point.y, bottom->point.y) <
          std::min(other->top->point.y, other->bottom->point.y)) {
    return false;
  }

  double denom = le_a * other->le_b - le_b * other->le_a;

  if (denom == 0.0) {
    return false;
  }

  double dx = static_cast<double>(other->top->point.x) - top->point.x;
  double dy = static_cast<double>(other->top->point.y) - top->point.y;

  double s_number = dy * other->le_b + dx * other->le_a;
  double t_number = dy * le_b + dx * le_a;

  if (denom > 0.0 ? (s_number < 0.0 || s_number > denom || t_number < 0.0 ||
                     t_number > denom)
                  : (s_number > 0.0 || s_number < denom || t_number > 0.0 ||
                     t_number < denom)) {
    return false;
  }

  double scale = 1.0 / denom;

  point->x = glm::round(
      static_cast<float>(top->point.x - s_number * le_b * scale));
  point->y = glm::round(
      static_cast<float>(top->point.y + s_number * le_a * scale));

  if (glm::isinf(point->x) || glm::isinf(point->y)) {
    return false;
  }

  return true;
}